

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O1

void __thiscall
absl::lts_20250127::synchronization_internal::GraphCycles::TestOnlyAddNodes
          (GraphCycles *this,uint32_t n)

{
  uint uVar1;
  Rep *this_00;
  ulong uVar2;
  
  this_00 = this->rep_;
  uVar1 = (this_00->nodes_).size_;
  uVar2 = (ulong)uVar1;
  if ((this_00->nodes_).capacity_ < n) {
    anon_unknown_0::Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node_*>
    ::Grow(&this_00->nodes_,n);
  }
  (this_00->nodes_).size_ = n;
  if (uVar1 < n) {
    do {
      (this->rep_->nodes_).ptr_[uVar2] = (Node *)0x0;
      uVar2 = uVar2 + 1;
    } while (n != uVar2);
  }
  return;
}

Assistant:

void GraphCycles::TestOnlyAddNodes(uint32_t n) {
  uint32_t old_size = rep_->nodes_.size();
  rep_->nodes_.resize(n);
  for (auto i = old_size; i < n; ++i) {
    rep_->nodes_[i] = nullptr;
  }
}